

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this,size_t n)

{
  memory_resource *pmVar1;
  float *pfVar2;
  ulong uVar3;
  int iVar4;
  undefined4 extraout_var;
  int i;
  ulong uVar5;
  
  if (this->nAlloc < n) {
    pmVar1 = (this->alloc).memoryResource;
    iVar4 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 4,4);
    pfVar2 = this->ptr;
    uVar3 = this->nStored;
    for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 1) {
      ((float *)CONCAT44(extraout_var,iVar4))[uVar5] = pfVar2[uVar5];
    }
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,pfVar2,this->nAlloc << 2,4);
    this->nAlloc = n;
    this->ptr = (float *)CONCAT44(extraout_var,iVar4);
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }